

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseChunk(xmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  byte bVar1;
  xmlChar xVar2;
  xmlChar *pxVar3;
  externalSubsetSAXFunc p_Var4;
  xmlDocPtr doc;
  xmlParserInputBufferPtr pxVar5;
  xmlParserErrors error;
  int iVar6;
  uint uVar7;
  int iVar8;
  xmlChar *pxVar9;
  byte *pbVar10;
  _xmlSAXHandler *p_Var11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  byte *pbVar15;
  char *msg;
  xmlParserInputState xVar16;
  xmlParserInputPtr pxVar17;
  byte *pbVar18;
  byte *pbVar19;
  byte *pbVar20;
  bool bVar21;
  bool bVar22;
  ulong uStack_60;
  int local_54;
  xmlChar *URI;
  xmlChar *prefix;
  uint local_3c;
  xmlValidCtxtPtr local_38;
  
  if (size < 0 || ctxt == (xmlParserCtxtPtr)0x0) {
    return 0x73;
  }
  if (chunk == (char *)0x0 && size != 0) {
    return 0x73;
  }
  pxVar17 = ctxt->input;
  if (pxVar17 == (xmlParserInputPtr)0x0) {
    return 0x73;
  }
  if (pxVar17->buf == (xmlParserInputBufferPtr)0x0) {
    return 0x73;
  }
  if (ctxt->disableSAX != 0) goto LAB_0013c770;
  *(byte *)&pxVar17->flags = (byte)pxVar17->flags | 0x40;
  if (ctxt->instate == XML_PARSER_START) {
    xmlCtxtInitializeLate(ctxt);
  }
  bVar21 = false;
  if (((terminate == 0) && (chunk != (char *)0x0)) && (size != 0)) {
    bVar21 = chunk[(ulong)(uint)size - 1] == '\r';
    size = size - (uint)bVar21;
  }
  pxVar17 = ctxt->input;
  pxVar9 = pxVar17->cur;
  pxVar3 = pxVar17->base;
  iVar6 = xmlParserInputBufferPush(pxVar17->buf,size,chunk);
  xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar9 - (long)pxVar3);
  pxVar17 = ctxt->input;
  if (iVar6 < 0) {
    xmlCtxtErrIO(ctxt,pxVar17->buf->error,(char *)0x0);
    xmlHaltParser(ctxt);
    goto LAB_0013c770;
  }
  if (pxVar17 != (xmlParserInputPtr)0x0) {
    if (0x1000 < (long)pxVar17->cur - (long)pxVar17->base) {
      xmlParserShrink(ctxt);
    }
    local_3c = (uint)(terminate == 0);
    local_38 = &ctxt->vctxt;
LAB_0013c844:
    if (ctxt->disableSAX != 0) goto switchD_0013c881_caseD_ffffffff;
    pxVar17 = ctxt->input;
    pbVar10 = pxVar17->cur;
    pbVar15 = pxVar17->end;
    uVar13 = (long)pbVar15 - (long)pbVar10;
    if (pbVar15 == pbVar10) goto switchD_0013c881_caseD_ffffffff;
    switch(ctxt->instate) {
    case XML_PARSER_START:
      if (((terminate == 0) && (uVar13 < 4)) ||
         (((*pbVar10 == 0x4c && ((pbVar10[1] == 0x6f && (pbVar10[2] == 0xa7)))) &&
          ((terminate == 0 && ((uVar13 < 200 && (pbVar10[3] == 0x94))))))))
      goto switchD_0013c881_caseD_ffffffff;
      xmlDetectEncoding(ctxt);
      ctxt->instate = XML_PARSER_XML_DECL;
      goto LAB_0013c844;
    case XML_PARSER_MISC:
    case XML_PARSER_PROLOG:
    case XML_PARSER_EPILOG:
      xmlSkipBlankChars(ctxt);
      pxVar9 = ctxt->input->cur;
      pxVar3 = ctxt->input->end;
      uVar13 = (long)pxVar3 - (long)pxVar9;
      if (pxVar3 == pxVar9) goto switchD_0013c881_caseD_ffffffff;
      if (*pxVar9 == '<') {
        if ((terminate == 0) && (uVar13 < 2)) goto switchD_0013c881_caseD_ffffffff;
        if (pxVar9[1] != '!') {
          if (pxVar9[1] != '?') goto LAB_0013ce65;
          if ((terminate == 0) &&
             (pxVar9 = xmlParseLookupString(ctxt,2,"?>",2), pxVar9 == (xmlChar *)0x0))
          goto switchD_0013c881_caseD_ffffffff;
          xmlParsePI(ctxt);
          goto LAB_0013c844;
        }
        if ((terminate == 0) && (uVar13 < 3)) goto switchD_0013c881_caseD_ffffffff;
        if (pxVar9[2] == '-') {
          if ((terminate == 0) && (uVar13 < 4)) goto switchD_0013c881_caseD_ffffffff;
          if (pxVar9[3] != '-') goto LAB_0013ce65;
          if ((terminate == 0) &&
             (pxVar9 = xmlParseLookupString(ctxt,4,"-->",3), pxVar9 == (xmlChar *)0x0))
          goto switchD_0013c881_caseD_ffffffff;
          xmlParseComment(ctxt);
          goto LAB_0013c844;
        }
        xVar16 = ctxt->instate;
        if (xVar16 == XML_PARSER_MISC) {
          if ((terminate == 0) && (uVar13 < 9)) goto switchD_0013c881_caseD_ffffffff;
          if (((pxVar9[2] != 'D') ||
              (((pxVar9[3] != 'O' || (pxVar9[4] != 'C')) || (pxVar9[5] != 'T')))) ||
             (((pxVar9[6] != 'Y' || (pxVar9[7] != 'P')) || (pxVar9[8] != 'E')))) goto LAB_0013ce65;
          if ((terminate == 0) && (iVar6 = xmlParseLookupGt(ctxt), iVar6 == 0))
          goto switchD_0013c881_caseD_ffffffff;
          ctxt->inSubset = 1;
          xmlParseDocTypeDecl(ctxt);
          xVar2 = *ctxt->input->cur;
          if (xVar2 != '>') {
            if (xVar2 != '[') goto LAB_0013cd66;
            ctxt->instate = XML_PARSER_DTD;
            goto LAB_0013c844;
          }
          xmlNextChar(ctxt);
          goto LAB_0013cd66;
        }
      }
      else {
LAB_0013ce65:
        xVar16 = ctxt->instate;
      }
      if (xVar16 == XML_PARSER_EPILOG) {
        if (ctxt->errNo == 0) {
          xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
        }
        ctxt->instate = XML_PARSER_EOF;
        xmlFinishDocument(ctxt);
        goto LAB_0013c844;
      }
      break;
    default:
      xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,"PP: internal error\n");
      ctxt->instate = XML_PARSER_EOF;
      goto LAB_0013c844;
    case XML_PARSER_DTD:
      if (terminate == 0) {
        uStack_60 = (ulong)(uint)ctxt->endCheckState;
        pbVar19 = pbVar10 + ctxt->checkIndex + (ulong)(ctxt->checkIndex == 0);
        pbVar20 = pbVar19;
LAB_0013c91f:
        if (pbVar19 < pbVar15) {
          bVar1 = *pbVar19;
          uVar13 = (ulong)bVar1;
          do {
            while (pbVar18 = pbVar20, uVar12 = (uint)uStack_60, pbVar20 = pbVar19, uVar12 == 0x20) {
              uStack_60 = 0;
              if (bVar1 < 0x3f) {
                if ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0) {
LAB_0013c999:
                  uStack_60 = 0x20;
                  goto LAB_0013c99c;
                }
                if (uVar13 == 0x3e) {
LAB_0013cd4f:
                  ctxt->checkIndex = 0;
                  ctxt->endCheckState = 0;
                  goto LAB_0013cd5e;
                }
              }
            }
            if (uVar12 != 0x5d) {
              if (uVar12 == 0) {
                uStack_60 = uVar13;
                if ((((((bVar1 == 0x22) || (bVar1 == 0x27)) || (bVar1 == 0x5d)) ||
                     ((uStack_60 = 0, bVar1 != 0x3c || (pbVar19[1] != 0x21)))) ||
                    (pbVar19[2] != 0x2d)) || (pbVar19[3] != 0x2d)) goto LAB_0013c99c;
                pbVar19 = pbVar19 + 4;
                uStack_60 = 0x2d;
                pbVar20 = pbVar19;
              }
              else {
                if (uVar12 != 0x2d) {
                  if (uVar12 == bVar1) {
                    uStack_60 = 0;
                    pbVar18 = pbVar19 + 1;
                  }
                  goto LAB_0013c99c;
                }
                if ((bVar1 != 0x2d) || (pbVar19[1] != 0x2d)) {
                  uStack_60 = 0x2d;
                  goto LAB_0013c99c;
                }
                uStack_60 = 0x2d;
                if (pbVar19[2] != 0x3e) goto LAB_0013c99c;
                pbVar19 = pbVar19 + 3;
                uStack_60 = 0;
                pbVar20 = pbVar19;
              }
              goto LAB_0013c91f;
            }
            uStack_60 = uVar13;
            if (bVar1 == 0x20) goto LAB_0013c99c;
            if (bVar1 == 0x3e) goto LAB_0013cd4f;
            if (((byte)(bVar1 - 9) < 2) || (bVar1 == 0xd)) goto LAB_0013c999;
            uStack_60 = 0;
          } while (bVar1 != 0x5d);
          uStack_60 = 0x5d;
LAB_0013c99c:
          pbVar19 = pbVar19 + 1;
          pbVar20 = pbVar18;
          goto LAB_0013c91f;
        }
        iVar6 = (int)uStack_60;
        if (((iVar6 == 0x2d) || (pbVar15 = pbVar19, iVar6 == 0)) &&
           (pbVar15 = pbVar19 + -3, (long)pbVar19 - (long)pbVar20 < 3)) {
          pbVar15 = pbVar20;
        }
        lVar14 = (long)pbVar15 - (long)pbVar10;
        bVar22 = lVar14 < 0;
        if (lVar14 < 1) {
          lVar14 = 0;
        }
        if (bVar22) {
          iVar6 = 0;
        }
        ctxt->checkIndex = lVar14;
        ctxt->endCheckState = iVar6;
        if (!bVar22) goto switchD_0013c881_caseD_ffffffff;
      }
LAB_0013cd5e:
      xmlParseInternalSubset(ctxt);
LAB_0013cd66:
      ctxt->inSubset = 2;
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
         (p_Var4 = ctxt->sax->externalSubset, p_Var4 != (externalSubsetSAXFunc)0x0)) {
        (*p_Var4)(ctxt->userData,ctxt->intSubName,ctxt->extSubSystem,ctxt->extSubURI);
      }
      ctxt->inSubset = 0;
      xmlCleanSpecialAttr(ctxt);
      ctxt->instate = XML_PARSER_PROLOG;
      goto LAB_0013c844;
    case XML_PARSER_START_TAG:
      prefix = (xmlChar *)0x0;
      URI = (xmlChar *)0x0;
      iVar6 = pxVar17->line;
      local_54 = 0;
      if ((terminate == 0) && (uVar13 < 2)) goto switchD_0013c881_caseD_ffffffff;
      if (*pbVar10 == 0x3c) {
        if ((terminate == 0) && (iVar8 = xmlParseLookupGt(ctxt), iVar8 == 0))
        goto switchD_0013c881_caseD_ffffffff;
        iVar8 = -1;
        if ((ctxt->spaceNr != 0) && (iVar8 = *ctxt->space, *ctxt->space == -2)) {
          iVar8 = -1;
        }
        spacePush(ctxt,iVar8);
        if (ctxt->sax2 == 0) {
          pxVar9 = xmlParseStartTag(ctxt);
        }
        else {
          pxVar9 = xmlParseStartTag2(ctxt,&prefix,&URI,&local_54);
        }
        if (pxVar9 != (xmlChar *)0x0) {
          if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
              (doc = ctxt->myDoc, doc != (xmlDocPtr)0x0)) &&
             ((ctxt->node != (_xmlNode *)0x0 && (ctxt->node == doc->children)))) {
            uVar12 = xmlValidateRoot(local_38,doc);
            ctxt->valid = ctxt->valid & uVar12;
          }
          pxVar17 = ctxt->input;
          pxVar3 = pxVar17->cur;
          if (*pxVar3 == '>') {
            xmlNextChar(ctxt);
            nameNsPush(ctxt,pxVar9,prefix,URI,iVar6,local_54);
          }
          else if ((*pxVar3 == '/') && (pxVar3[1] == '>')) {
            pxVar17->cur = pxVar3 + 2;
            pxVar17->col = pxVar17->col + 2;
            if (pxVar3[2] == '\0') {
              xmlParserGrow(ctxt);
            }
            p_Var11 = ctxt->sax;
            if (ctxt->sax2 == 0) {
              if (((p_Var11 != (_xmlSAXHandler *)0x0) &&
                  (p_Var11->endElement != (endElementSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
                (*p_Var11->endElement)(ctxt->userData,pxVar9);
              }
            }
            else {
              if (((p_Var11 != (_xmlSAXHandler *)0x0) &&
                  (p_Var11->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0))
              {
                (*p_Var11->endElementNs)(ctxt->userData,pxVar9,prefix,URI);
              }
              if (0 < local_54) {
                xmlParserNsPop(ctxt,local_54);
              }
            }
            spacePop(ctxt);
          }
          else {
            xmlFatalErrMsgStr(ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s\n",pxVar9
                             );
            nodePop(ctxt);
            spacePop(ctxt);
            if (0 < local_54) {
              xmlParserNsPop(ctxt,local_54);
            }
          }
          xVar16 = XML_PARSER_CONTENT;
          if (ctxt->nameNr == 0) {
            xVar16 = XML_PARSER_EPILOG;
          }
          ctxt->instate = xVar16;
          goto LAB_0013c844;
        }
        spacePop(ctxt);
      }
      else {
        xmlFatalErrMsg(ctxt,XML_ERR_DOCUMENT_EMPTY,"Start tag expected, \'<\' not found");
      }
      ctxt->instate = XML_PARSER_EOF;
      xmlFinishDocument(ctxt);
      goto switchD_0013c881_caseD_ffffffff;
    case XML_PARSER_CONTENT:
      if (*pbVar10 == 0x26) {
        if ((terminate == 0) && (iVar6 = xmlParseLookupChar(ctxt,0x3b), iVar6 == 0))
        goto switchD_0013c881_caseD_ffffffff;
        xmlParseReference(ctxt);
        goto LAB_0013c844;
      }
      if (*pbVar10 != 0x3c) {
        if ((terminate == 0) && (uVar13 < 300)) {
          for (lVar14 = ctxt->checkIndex; pbVar10 + lVar14 < pbVar15; lVar14 = lVar14 + 1) {
            bVar1 = pbVar10[lVar14];
            if ((bVar1 == 0x26) || (bVar1 == 0x3c)) goto LAB_0013cfc8;
          }
          bVar22 = -1 < lVar14;
          if (lVar14 < 1) {
            lVar14 = 0;
          }
          ctxt->checkIndex = lVar14;
          if (bVar22) goto switchD_0013c881_caseD_ffffffff;
        }
LAB_0013cfc8:
        ctxt->checkIndex = 0;
        xmlParseCharDataInternal(ctxt,local_3c);
        goto LAB_0013c844;
      }
      if ((terminate == 0) && (uVar13 < 2)) goto switchD_0013c881_caseD_ffffffff;
      bVar1 = pbVar10[1];
      if (bVar1 == 0x21) {
        if ((terminate == 0) && (uVar13 < 3)) goto switchD_0013c881_caseD_ffffffff;
        if (pbVar10[2] == 0x5b) {
          if ((terminate == 0) && (uVar13 < 9)) goto switchD_0013c881_caseD_ffffffff;
          if ((pbVar10[3] == 0x43) &&
             ((((pbVar10[4] == 0x44 && (pbVar10[5] == 0x41)) && (pbVar10[6] == 0x54)) &&
              ((pbVar10[7] == 0x41 && (pbVar10[8] == 0x5b)))))) {
            if ((terminate != 0) ||
               (pxVar9 = xmlParseLookupString(ctxt,9,"]]>",3), pxVar9 != (xmlChar *)0x0)) {
              ctxt->instate = XML_PARSER_CDATA_SECTION;
              xmlParseCDSect(ctxt);
              goto LAB_0013ceb5;
            }
            goto switchD_0013c881_caseD_ffffffff;
          }
        }
        else if (pbVar10[2] == 0x2d) {
          if ((terminate == 0) && (uVar13 < 4)) goto switchD_0013c881_caseD_ffffffff;
          if (pbVar10[3] == 0x2d) {
            if ((terminate != 0) ||
               (pxVar9 = xmlParseLookupString(ctxt,4,"-->",3), pxVar9 != (xmlChar *)0x0)) {
              xmlParseComment(ctxt);
              goto LAB_0013ceb5;
            }
            goto switchD_0013c881_caseD_ffffffff;
          }
        }
      }
      else {
        if (bVar1 == 0x3f) {
          if ((terminate == 0) &&
             (pxVar9 = xmlParseLookupString(ctxt,2,"?>",2), pxVar9 == (xmlChar *)0x0))
          goto switchD_0013c881_caseD_ffffffff;
          xmlParsePI(ctxt);
LAB_0013ceb5:
          ctxt->instate = XML_PARSER_CONTENT;
          goto LAB_0013c844;
        }
        if (bVar1 == 0x2f) {
          ctxt->instate = XML_PARSER_END_TAG;
          goto LAB_0013c844;
        }
      }
      break;
    case XML_PARSER_END_TAG:
      if (terminate == 0) {
        pxVar17 = (xmlParserInputPtr)0x3e;
        iVar6 = xmlParseLookupChar(ctxt,0x3e);
        if (iVar6 == 0) goto switchD_0013c881_caseD_ffffffff;
      }
      if (ctxt->sax2 == 0) {
        xmlParseEndTag1(ctxt,(int)pxVar17);
        uVar12 = ctxt->nameNr;
      }
      else {
        xmlParseEndTag2(ctxt,ctxt->pushTab + (long)ctxt->nameNr + -1);
        uVar12 = ctxt->nameNr;
        if (0 < (long)(int)uVar12) {
          uVar7 = uVar12 - 1;
          ctxt->nameNr = uVar7;
          if (uVar12 == 1) {
            pxVar9 = (xmlChar *)0x0;
          }
          else {
            pxVar9 = ctxt->nameTab[(long)(int)uVar12 + -2];
          }
          ctxt->name = pxVar9;
          ctxt->nameTab[uVar7] = (xmlChar *)0x0;
          uVar12 = uVar7;
        }
      }
      if (uVar12 != 0) goto LAB_0013ceb5;
      ctxt->instate = XML_PARSER_EPILOG;
      goto LAB_0013c844;
    case XML_PARSER_XML_DECL:
      if ((terminate == 0) && (uVar13 < 2)) goto switchD_0013c881_caseD_ffffffff;
      if ((*pbVar10 == 0x3c) && (pbVar10[1] == 0x3f)) {
        if (terminate == 0) {
          pxVar9 = xmlParseLookupString(ctxt,2,"?>",2);
          if (pxVar9 == (xmlChar *)0x0) goto switchD_0013c881_caseD_ffffffff;
          pbVar10 = ctxt->input->cur;
        }
        if (((pbVar10[2] != 0x78) || (pbVar10[3] != 0x6d)) ||
           ((pbVar10[4] != 0x6c ||
            ((0x20 < (ulong)pbVar10[5] || ((0x100002600U >> ((ulong)pbVar10[5] & 0x3f) & 1) == 0))))
           )) goto LAB_0013cc01;
        xmlParseXMLDecl(ctxt);
LAB_0013cc1a:
        p_Var11 = ctxt->sax;
        if (p_Var11 != (_xmlSAXHandler *)0x0) {
          if (p_Var11->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0) {
            (*p_Var11->setDocumentLocator)(ctxt->userData,&xmlDefaultSAXLocator);
            p_Var11 = ctxt->sax;
            if (p_Var11 == (_xmlSAXHandler *)0x0) goto LAB_0013cc58;
          }
          if ((p_Var11->startDocument != (startDocumentSAXFunc)0x0) && (ctxt->disableSAX == 0)) {
            (*p_Var11->startDocument)(ctxt->userData);
          }
        }
LAB_0013cc58:
        ctxt->instate = XML_PARSER_MISC;
      }
      else {
LAB_0013cc01:
        pxVar9 = xmlCharStrdup("1.0");
        ctxt->version = pxVar9;
        if (pxVar9 != (xmlChar *)0x0) goto LAB_0013cc1a;
        xmlCtxtErrMemory(ctxt);
      }
      goto LAB_0013c844;
    case XML_PARSER_EOF:
      goto switchD_0013c881_caseD_ffffffff;
    }
    ctxt->instate = XML_PARSER_START_TAG;
    goto LAB_0013c844;
  }
switchD_0013c881_caseD_ffffffff:
  uVar13 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar13 = 10000000;
  }
  if (uVar13 < (ulong)((long)ctxt->input->cur - (long)ctxt->input->base)) {
    xmlFatalErr(ctxt,XML_ERR_RESOURCE_LIMIT,"Buffer size limit exceeded, try XML_PARSE_HUGE\n");
    xmlHaltParser(ctxt);
  }
  if ((ctxt->errNo != 0) && (ctxt->disableSAX != 0)) {
    return ctxt->errNo;
  }
  if (bVar21) {
    pxVar17 = ctxt->input;
    pxVar9 = pxVar17->cur;
    pxVar3 = pxVar17->base;
    iVar6 = xmlParserInputBufferPush(pxVar17->buf,1,"\r");
    xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar9 - (long)pxVar3);
    if (iVar6 < 0) {
      xmlCtxtErrIO(ctxt,ctxt->input->buf->error,(char *)0x0);
      xmlHaltParser(ctxt);
      goto LAB_0013c770;
    }
  }
  if (terminate != 0) {
    xVar16 = ctxt->instate;
    if ((xVar16 == XML_PARSER_EOF) || (xVar16 == XML_PARSER_EPILOG)) {
      pxVar5 = ctxt->input->buf;
      if ((pxVar5->encoder != (xmlCharEncodingHandlerPtr)0x0) &&
         ((pxVar5->error == 0 && (iVar6 = xmlBufIsEmpty(pxVar5->raw), iVar6 == 0)))) {
        msg = "Truncated multi-byte sequence at EOF\n";
        error = XML_ERR_INVALID_CHAR;
LAB_0013d40d:
        xmlFatalErrMsg(ctxt,error,msg);
      }
    }
    else if (ctxt->nameNr < 1) {
      if (xVar16 != XML_PARSER_START) {
        msg = "Start tag expected, \'<\' not found\n";
        error = XML_ERR_DOCUMENT_EMPTY;
        goto LAB_0013d40d;
      }
      xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
    }
    else {
      uVar12 = ctxt->nameNr - 1;
      xmlFatalErrMsgStrIntStr
                (ctxt,XML_ERR_TAG_NOT_FINISHED,"Premature end of data in tag %s line %d\n",
                 ctxt->nameTab[uVar12],ctxt->pushTab[uVar12].line,(xmlChar *)0x0);
    }
    if (ctxt->instate != XML_PARSER_EOF) {
      ctxt->instate = XML_PARSER_EOF;
      xmlFinishDocument(ctxt);
    }
  }
  if (ctxt->wellFormed != 0) {
    return 0;
  }
LAB_0013c770:
  return ctxt->errNo;
}

Assistant:

int
xmlParseChunk(xmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    size_t curBase;
    size_t maxLength;
    size_t pos;
    int end_in_lf = 0;
    int res;

    if ((ctxt == NULL) || (size < 0))
        return(XML_ERR_ARGUMENT);
    if ((chunk == NULL) && (size > 0))
        return(XML_ERR_ARGUMENT);
    if ((ctxt->input == NULL) || (ctxt->input->buf == NULL))
        return(XML_ERR_ARGUMENT);
    if (ctxt->disableSAX != 0)
        return(ctxt->errNo);

    ctxt->input->flags |= XML_INPUT_PROGRESSIVE;
    if (ctxt->instate == XML_PARSER_START)
        xmlCtxtInitializeLate(ctxt);
    if ((size > 0) && (chunk != NULL) && (!terminate) &&
        (chunk[size - 1] == '\r')) {
	end_in_lf = 1;
	size--;
    }

    /*
     * Also push an empty chunk to make sure that the raw buffer
     * will be flushed if there is an encoder.
     */
    pos = ctxt->input->cur - ctxt->input->base;
    res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
    xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
    if (res < 0) {
        xmlCtxtErrIO(ctxt, ctxt->input->buf->error, NULL);
        xmlHaltParser(ctxt);
        return(ctxt->errNo);
    }

    xmlParseTryOrFinish(ctxt, terminate);

    curBase = ctxt->input->cur - ctxt->input->base;
    maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                XML_MAX_HUGE_LENGTH :
                XML_MAX_LOOKUP_LIMIT;
    if (curBase > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT,
                    "Buffer size limit exceeded, try XML_PARSE_HUGE\n");
        xmlHaltParser(ctxt);
    }

    if ((ctxt->errNo != XML_ERR_OK) && (ctxt->disableSAX != 0))
        return(ctxt->errNo);

    if (end_in_lf == 1) {
	pos = ctxt->input->cur - ctxt->input->base;
	res = xmlParserInputBufferPush(ctxt->input->buf, 1, "\r");
	xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
        if (res < 0) {
            xmlCtxtErrIO(ctxt, ctxt->input->buf->error, NULL);
            xmlHaltParser(ctxt);
            return(ctxt->errNo);
        }
    }
    if (terminate) {
	/*
	 * Check for termination
	 */
        if ((ctxt->instate != XML_PARSER_EOF) &&
            (ctxt->instate != XML_PARSER_EPILOG)) {
            if (ctxt->nameNr > 0) {
                const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
                int line = ctxt->pushTab[ctxt->nameNr - 1].line;
                xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                        "Premature end of data in tag %s line %d\n",
                        name, line, NULL);
            } else if (ctxt->instate == XML_PARSER_START) {
                xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
            } else {
                xmlFatalErrMsg(ctxt, XML_ERR_DOCUMENT_EMPTY,
                               "Start tag expected, '<' not found\n");
            }
        } else if ((ctxt->input->buf->encoder != NULL) &&
                   (ctxt->input->buf->error == 0) &&
                   (!xmlBufIsEmpty(ctxt->input->buf->raw))) {
            xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                           "Truncated multi-byte sequence at EOF\n");
        }
	if (ctxt->instate != XML_PARSER_EOF) {
            ctxt->instate = XML_PARSER_EOF;
            xmlFinishDocument(ctxt);
	}
    }
    if (ctxt->wellFormed == 0)
	return((xmlParserErrors) ctxt->errNo);
    else
        return(0);
}